

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getarg_tests.cpp
# Opt level: O1

void __thiscall getarg_tests::patharg::test_method(patharg *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  string arg;
  string arg_00;
  string arg_01;
  string arg_02;
  string arg_03;
  string arg_04;
  string arg_05;
  string arg_06;
  string arg_07;
  string arg_08;
  string arg_09;
  string arg_10;
  string arg_11;
  string arg_12;
  string arg_13;
  string arg_14;
  string arg_15;
  string arg_16;
  string arg_17;
  string arg_18;
  string arg_19;
  string arg_20;
  string arg_21;
  string arg_22;
  string arg_23;
  string arg_24;
  int iVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  long in_FS_OFFSET;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  undefined8 in_stack_fffffffffffff558;
  undefined1 *puVar6;
  undefined8 in_stack_fffffffffffff560;
  undefined1 *puVar7;
  undefined8 in_stack_fffffffffffff568;
  char *pcVar8;
  undefined8 in_stack_fffffffffffff570;
  char *pcVar9;
  undefined1 *local_a88;
  undefined1 *local_a80;
  char *local_a78;
  char *local_a70;
  undefined1 *local_a68;
  undefined1 *local_a60;
  char *local_a58;
  char *local_a50;
  undefined1 *local_a48;
  undefined1 *local_a40;
  char *local_a38;
  char *local_a30;
  assertion_result local_a28;
  char *local_a10;
  undefined1 *local_a08;
  undefined1 *local_a00;
  char *local_9f8;
  char *local_9f0;
  undefined1 *local_9e8;
  undefined1 *local_9e0;
  char *local_9d8;
  char *local_9d0;
  undefined1 *local_9c8;
  undefined1 *local_9c0;
  char *local_9b8;
  char *local_9b0;
  undefined1 *local_9a8;
  undefined1 *local_9a0;
  char *local_998;
  char *local_990;
  undefined1 *local_988;
  undefined1 *local_980;
  char *local_978;
  char *local_970;
  undefined1 *local_968;
  undefined1 *local_960;
  char *local_958;
  char *local_950;
  undefined1 *local_948;
  undefined1 *local_940;
  char *local_938;
  char *local_930;
  undefined1 *local_928;
  undefined1 *local_920;
  char *local_918;
  char *local_910;
  undefined1 *local_908;
  undefined1 *local_900;
  char *local_8f8;
  char *local_8f0;
  undefined1 *local_8e8;
  undefined1 *local_8e0;
  char *local_8d8;
  char *local_8d0;
  undefined1 *local_8c8;
  undefined1 *local_8c0;
  char *local_8b8;
  char *local_8b0;
  undefined1 *local_8a8;
  undefined1 *local_8a0;
  char *local_898;
  char *local_890;
  undefined1 *local_888;
  undefined1 *local_880;
  char *local_878;
  char *local_870;
  undefined1 *local_868;
  undefined1 *local_860;
  char *local_858;
  char *local_850;
  undefined1 *local_848;
  undefined1 *local_840;
  char *local_838;
  char *local_830;
  undefined1 *local_828;
  undefined1 *local_820;
  char *local_818;
  char *local_810;
  undefined1 *local_808;
  undefined1 *local_800;
  char *local_7f8;
  char *local_7f0;
  undefined1 *local_7e8;
  undefined1 *local_7e0;
  char *local_7d8;
  char *local_7d0;
  undefined1 *local_7c8;
  undefined1 *local_7c0;
  char *local_7b8;
  char *local_7b0;
  undefined1 *local_7a8;
  undefined1 *local_7a0;
  char *local_798;
  char *local_790;
  undefined1 *local_788;
  undefined1 *local_780;
  char *local_778;
  char *local_770;
  undefined1 *local_768;
  undefined1 *local_760;
  char *local_758;
  char *local_750;
  path *local_748;
  assertion_result local_740;
  path **local_728;
  path *local_720;
  assertion_result local_718;
  path **local_700;
  path *local_6f8;
  char *local_6f0;
  assertion_result local_6e8;
  undefined1 local_6d0 [32];
  undefined1 local_6b0 [32];
  undefined1 local_690 [32];
  undefined1 local_670 [32];
  undefined1 local_650 [16];
  undefined1 *local_640;
  undefined8 local_638;
  undefined1 local_628 [32];
  undefined1 local_608 [32];
  undefined1 local_5e8 [32];
  undefined1 local_5c8 [32];
  undefined1 local_5a8 [32];
  undefined1 local_588 [32];
  undefined1 local_568 [32];
  undefined1 local_548 [40];
  ulong uStack_520;
  undefined1 *local_518;
  path **pppStack_510;
  undefined8 local_508;
  undefined1 local_4f8 [32];
  undefined1 local_4d8 [32];
  undefined1 local_4b8 [32];
  undefined1 local_498 [32];
  undefined1 local_478 [32];
  undefined1 local_458 [32];
  undefined1 local_438 [32];
  undefined1 local_418 [32];
  undefined1 local_3f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  _List local_3d8;
  undefined1 local_3c8 [32];
  undefined1 local_3a8 [32];
  undefined1 local_388 [32];
  undefined1 local_368 [32];
  undefined1 local_348 [32];
  path relative_path;
  path absolute_path;
  undefined1 local_2c8 [32];
  path root_path;
  ArgsManager local_args;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::ArgsManager(&local_args);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&root_path,"-dir",(allocator<char> *)&relative_path);
  root_path.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl._0_4_ =
       1;
  __l._M_len = 1;
  __l._M_array = (iterator)&root_path;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)&absolute_path,__l,(allocator_type *)&relative_path.super_path);
  SetupArgs(&local_args,
            (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)&absolute_path);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)&absolute_path);
  paVar1 = &root_path.super_path._M_pathname.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)root_path.super_path._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(root_path.super_path._M_pathname._M_dataplus._M_p,
                    root_path.super_path._M_pathname.field_2._M_allocated_capacity + 1);
  }
  root_path.super_path._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&root_path,"");
  ResetArgs(&local_args,(string *)&root_path);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)root_path.super_path._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(root_path.super_path._M_pathname._M_dataplus._M_p,
                    root_path.super_path._M_pathname.field_2._M_allocated_capacity + 1);
  }
  local_758 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_750 = "";
  local_768 = &boost::unit_test::basic_cstring<char_const>::null;
  local_760 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x117;
  file.m_begin = (iterator)&local_758;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_768,msg);
  local_650[8] = false;
  local_650._0_8_ = &PTR__lazy_ostream_013abb30;
  local_640 = boost::unit_test::lazy_ostream::inst;
  local_638 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_2c8._0_8_ = local_2c8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"-dir","");
  absolute_path.super_path._M_pathname.field_2._M_allocated_capacity = 0;
  absolute_path.super_path._M_pathname.field_2._8_8_ = 0;
  absolute_path.super_path._M_pathname._M_dataplus._M_p = (pointer)0x0;
  absolute_path.super_path._M_pathname._M_string_length = 0;
  absolute_path.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path(&absolute_path.super_path);
  arg._M_string_length = in_stack_fffffffffffff560;
  arg._M_dataplus._M_p = (pointer)in_stack_fffffffffffff558;
  arg.field_2._M_allocated_capacity = in_stack_fffffffffffff568;
  arg.field_2._8_8_ = in_stack_fffffffffffff570;
  ArgsManager::GetPathArg((path *)&root_path.super_path,&local_args,arg,(path *)local_2c8);
  relative_path.super_path._M_pathname.field_2._M_allocated_capacity = 0;
  relative_path.super_path._M_pathname.field_2._8_8_ = 0;
  relative_path.super_path._M_pathname._M_dataplus._M_p = (pointer)0x0;
  relative_path.super_path._M_pathname._M_string_length = 0;
  relative_path.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path(&relative_path.super_path);
  iVar3 = std::filesystem::__cxx11::path::compare(&root_path.super_path);
  local_718.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar3 == 0);
  local_718.m_message.px = (element_type *)0x0;
  local_718.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_740._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_740.m_message.px = (element_type *)0xe9616d;
  local_3e8._8_8_ = &local_a28;
  local_3f8._8_8_ = local_3f8._8_8_ & 0xffffffffffffff00;
  local_3f8._0_8_ = &PTR__lazy_ostream_013ac130;
  local_3e8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pppStack_510 = (path **)&local_6e8;
  uStack_520 = uStack_520 & 0xffffffffffffff00;
  local_548._32_8_ = &PTR__lazy_ostream_013ac130;
  local_518 = boost::unit_test::lazy_ostream::inst;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_a28._0_8_ = &root_path.super_path;
  local_6e8._0_8_ = &relative_path.super_path;
  boost::test_tools::tt_detail::report_assertion
            (&local_718,(lazy_ostream *)local_650,1,2,REQUIRE,0xe96581,(size_t)&local_740,0x117,
             local_3f8,"fs::path{}",local_548 + 0x20);
  boost::detail::shared_count::~shared_count(&local_718.m_message.pn);
  std::filesystem::__cxx11::path::~path(&relative_path.super_path);
  std::filesystem::__cxx11::path::~path(&root_path.super_path);
  std::filesystem::__cxx11::path::~path(&absolute_path.super_path);
  if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
    operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
  }
  absolute_path.super_path._M_pathname._M_dataplus._M_p = "/";
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&root_path.super_path,(char **)&absolute_path,auto_format);
  paVar1 = &absolute_path.super_path._M_pathname.field_2;
  absolute_path.super_path._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&absolute_path,"-dir=/","");
  ResetArgs(&local_args,(string *)&absolute_path);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)absolute_path.super_path._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(absolute_path.super_path._M_pathname._M_dataplus._M_p,
                    absolute_path.super_path._M_pathname.field_2._M_allocated_capacity + 1);
  }
  local_778 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_770 = "";
  local_788 = &boost::unit_test::basic_cstring<char_const>::null;
  local_780 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x11b;
  file_00.m_begin = (iterator)&local_778;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_788,
             msg_00);
  local_650[8] = false;
  local_650._0_8_ = &PTR__lazy_ostream_013abb30;
  local_640 = boost::unit_test::lazy_ostream::inst;
  local_638 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_348._0_8_ = (long)local_348 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"-dir","");
  relative_path.super_path._M_pathname.field_2._M_allocated_capacity = 0;
  relative_path.super_path._M_pathname.field_2._8_8_ = 0;
  relative_path.super_path._M_pathname._M_dataplus._M_p = (pointer)0x0;
  relative_path.super_path._M_pathname._M_string_length = 0;
  relative_path.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path(&relative_path.super_path);
  arg_00._M_string_length = in_stack_fffffffffffff560;
  arg_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff558;
  arg_00.field_2._M_allocated_capacity = in_stack_fffffffffffff568;
  arg_00.field_2._8_8_ = in_stack_fffffffffffff570;
  ArgsManager::GetPathArg((path *)&absolute_path.super_path,&local_args,arg_00,(path *)local_348);
  iVar3 = std::filesystem::__cxx11::path::compare(&absolute_path.super_path);
  local_718.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar3 == 0);
  local_718.m_message.px = (element_type *)0x0;
  local_718.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_740._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_740.m_message.px = (element_type *)0xe9616d;
  local_3f8._8_8_ = local_3f8._8_8_ & 0xffffffffffffff00;
  local_3f8._0_8_ = &PTR__lazy_ostream_013ac130;
  local_3e8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_3e8._8_8_ = &local_a28;
  uStack_520 = uStack_520 & 0xffffffffffffff00;
  local_548._32_8_ = &PTR__lazy_ostream_013ac130;
  local_518 = boost::unit_test::lazy_ostream::inst;
  pppStack_510 = (path **)&local_6e8;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_a28._0_8_ = &absolute_path.super_path;
  local_6e8._0_8_ = &root_path.super_path;
  boost::test_tools::tt_detail::report_assertion
            (&local_718,(lazy_ostream *)local_650,1,2,REQUIRE,0xe96581,(size_t)&local_740,0x11b,
             local_3f8,"root_path",local_548 + 0x20);
  boost::detail::shared_count::~shared_count(&local_718.m_message.pn);
  std::filesystem::__cxx11::path::~path(&absolute_path.super_path);
  std::filesystem::__cxx11::path::~path(&relative_path.super_path);
  if (local_348._0_8_ != (long)local_348 + 0x10) {
    operator_delete((void *)local_348._0_8_,local_348._16_8_ + 1);
  }
  absolute_path.super_path._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&absolute_path,"-dir=/.","");
  ResetArgs(&local_args,(string *)&absolute_path);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)absolute_path.super_path._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(absolute_path.super_path._M_pathname._M_dataplus._M_p,
                    absolute_path.super_path._M_pathname.field_2._M_allocated_capacity + 1);
  }
  local_798 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_790 = "";
  local_7a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x11e;
  file_01.m_begin = (iterator)&local_798;
  msg_01.m_end = pvVar5;
  msg_01.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_7a8,
             msg_01);
  local_650[8] = false;
  local_650._0_8_ = &PTR__lazy_ostream_013abb30;
  local_640 = boost::unit_test::lazy_ostream::inst;
  local_638 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_368._0_8_ = (long)local_368 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"-dir","");
  relative_path.super_path._M_pathname.field_2._M_allocated_capacity = 0;
  relative_path.super_path._M_pathname.field_2._8_8_ = 0;
  relative_path.super_path._M_pathname._M_dataplus._M_p = (pointer)0x0;
  relative_path.super_path._M_pathname._M_string_length = 0;
  relative_path.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path(&relative_path.super_path);
  arg_01._M_string_length = in_stack_fffffffffffff560;
  arg_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff558;
  arg_01.field_2._M_allocated_capacity = in_stack_fffffffffffff568;
  arg_01.field_2._8_8_ = in_stack_fffffffffffff570;
  ArgsManager::GetPathArg((path *)&absolute_path.super_path,&local_args,arg_01,(path *)local_368);
  iVar3 = std::filesystem::__cxx11::path::compare(&absolute_path.super_path);
  local_718.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar3 == 0);
  local_718.m_message.px = (element_type *)0x0;
  local_718.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_740._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_740.m_message.px = (element_type *)0xe9616d;
  local_3f8._8_8_ = local_3f8._8_8_ & 0xffffffffffffff00;
  local_3f8._0_8_ = &PTR__lazy_ostream_013ac130;
  local_3e8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_3e8._8_8_ = &local_a28;
  uStack_520 = uStack_520 & 0xffffffffffffff00;
  local_548._32_8_ = &PTR__lazy_ostream_013ac130;
  local_518 = boost::unit_test::lazy_ostream::inst;
  pppStack_510 = (path **)&local_6e8;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_a28._0_8_ = &absolute_path.super_path;
  local_6e8._0_8_ = &root_path.super_path;
  boost::test_tools::tt_detail::report_assertion
            (&local_718,(lazy_ostream *)local_650,1,2,REQUIRE,0xe96581,(size_t)&local_740,0x11e,
             local_3f8,"root_path",local_548 + 0x20);
  boost::detail::shared_count::~shared_count(&local_718.m_message.pn);
  std::filesystem::__cxx11::path::~path(&absolute_path.super_path);
  std::filesystem::__cxx11::path::~path(&relative_path.super_path);
  if (local_368._0_8_ != (long)local_368 + 0x10) {
    operator_delete((void *)local_368._0_8_,local_368._16_8_ + 1);
  }
  absolute_path.super_path._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&absolute_path,"-dir=/./","");
  ResetArgs(&local_args,(string *)&absolute_path);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)absolute_path.super_path._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(absolute_path.super_path._M_pathname._M_dataplus._M_p,
                    absolute_path.super_path._M_pathname.field_2._M_allocated_capacity + 1);
  }
  local_7b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_7b0 = "";
  local_7c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x121;
  file_02.m_begin = (iterator)&local_7b8;
  msg_02.m_end = pvVar5;
  msg_02.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_7c8,
             msg_02);
  local_650[8] = false;
  local_650._0_8_ = &PTR__lazy_ostream_013abb30;
  local_640 = boost::unit_test::lazy_ostream::inst;
  local_638 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_388._0_8_ = (long)local_388 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"-dir","");
  relative_path.super_path._M_pathname.field_2._M_allocated_capacity = 0;
  relative_path.super_path._M_pathname.field_2._8_8_ = 0;
  relative_path.super_path._M_pathname._M_dataplus._M_p = (pointer)0x0;
  relative_path.super_path._M_pathname._M_string_length = 0;
  relative_path.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path(&relative_path.super_path);
  arg_02._M_string_length = in_stack_fffffffffffff560;
  arg_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff558;
  arg_02.field_2._M_allocated_capacity = in_stack_fffffffffffff568;
  arg_02.field_2._8_8_ = in_stack_fffffffffffff570;
  ArgsManager::GetPathArg((path *)&absolute_path.super_path,&local_args,arg_02,(path *)local_388);
  iVar3 = std::filesystem::__cxx11::path::compare(&absolute_path.super_path);
  local_718.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar3 == 0);
  local_718.m_message.px = (element_type *)0x0;
  local_718.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_740._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_740.m_message.px = (element_type *)0xe9616d;
  local_3f8._8_8_ = local_3f8._8_8_ & 0xffffffffffffff00;
  local_3f8._0_8_ = &PTR__lazy_ostream_013ac130;
  local_3e8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_3e8._8_8_ = &local_a28;
  uStack_520 = uStack_520 & 0xffffffffffffff00;
  local_548._32_8_ = &PTR__lazy_ostream_013ac130;
  local_518 = boost::unit_test::lazy_ostream::inst;
  pppStack_510 = (path **)&local_6e8;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_a28._0_8_ = &absolute_path.super_path;
  local_6e8._0_8_ = &root_path.super_path;
  boost::test_tools::tt_detail::report_assertion
            (&local_718,(lazy_ostream *)local_650,1,2,REQUIRE,0xe96581,(size_t)&local_740,0x121,
             local_3f8,"root_path",local_548 + 0x20);
  boost::detail::shared_count::~shared_count(&local_718.m_message.pn);
  std::filesystem::__cxx11::path::~path(&absolute_path.super_path);
  std::filesystem::__cxx11::path::~path(&relative_path.super_path);
  if (local_388._0_8_ != (long)local_388 + 0x10) {
    operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
  }
  absolute_path.super_path._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&absolute_path,"-dir=/.//","");
  ResetArgs(&local_args,(string *)&absolute_path);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)absolute_path.super_path._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(absolute_path.super_path._M_pathname._M_dataplus._M_p,
                    absolute_path.super_path._M_pathname.field_2._M_allocated_capacity + 1);
  }
  local_7d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_7d0 = "";
  local_7e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x124;
  file_03.m_begin = (iterator)&local_7d8;
  msg_03.m_end = pvVar5;
  msg_03.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_7e8,
             msg_03);
  local_650[8] = false;
  local_650._0_8_ = &PTR__lazy_ostream_013abb30;
  local_640 = boost::unit_test::lazy_ostream::inst;
  local_638 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3a8._0_8_ = (long)local_3a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"-dir","");
  relative_path.super_path._M_pathname.field_2._M_allocated_capacity = 0;
  relative_path.super_path._M_pathname.field_2._8_8_ = 0;
  relative_path.super_path._M_pathname._M_dataplus._M_p = (pointer)0x0;
  relative_path.super_path._M_pathname._M_string_length = 0;
  relative_path.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path(&relative_path.super_path);
  arg_03._M_string_length = in_stack_fffffffffffff560;
  arg_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff558;
  arg_03.field_2._M_allocated_capacity = in_stack_fffffffffffff568;
  arg_03.field_2._8_8_ = in_stack_fffffffffffff570;
  ArgsManager::GetPathArg((path *)&absolute_path.super_path,&local_args,arg_03,(path *)local_3a8);
  iVar3 = std::filesystem::__cxx11::path::compare(&absolute_path.super_path);
  local_718.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar3 == 0);
  local_718.m_message.px = (element_type *)0x0;
  local_718.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_740._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_740.m_message.px = (element_type *)0xe9616d;
  local_3f8._8_8_ = local_3f8._8_8_ & 0xffffffffffffff00;
  local_3f8._0_8_ = &PTR__lazy_ostream_013ac130;
  local_3e8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_3e8._8_8_ = &local_a28;
  uStack_520 = uStack_520 & 0xffffffffffffff00;
  local_548._32_8_ = &PTR__lazy_ostream_013ac130;
  local_518 = boost::unit_test::lazy_ostream::inst;
  pppStack_510 = (path **)&local_6e8;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_a28._0_8_ = &absolute_path.super_path;
  local_6e8._0_8_ = &root_path.super_path;
  boost::test_tools::tt_detail::report_assertion
            (&local_718,(lazy_ostream *)local_650,1,2,REQUIRE,0xe96581,(size_t)&local_740,0x124,
             local_3f8,"root_path",local_548 + 0x20);
  boost::detail::shared_count::~shared_count(&local_718.m_message.pn);
  std::filesystem::__cxx11::path::~path(&absolute_path.super_path);
  std::filesystem::__cxx11::path::~path(&relative_path.super_path);
  if (local_3a8._0_8_ != (long)local_3a8 + 0x10) {
    operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ + 1);
  }
  relative_path.super_path._M_pathname._M_dataplus._M_p = "/home/user/.bitcoin";
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&absolute_path.super_path,(char **)&relative_path,auto_format);
  paVar1 = &relative_path.super_path._M_pathname.field_2;
  relative_path.super_path._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&relative_path,"-dir=/home/user/.bitcoin","");
  ResetArgs(&local_args,(string *)&relative_path);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)relative_path.super_path._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(relative_path.super_path._M_pathname._M_dataplus._M_p,
                    relative_path.super_path._M_pathname.field_2._M_allocated_capacity + 1);
  }
  local_7f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_7f0 = "";
  local_808 = &boost::unit_test::basic_cstring<char_const>::null;
  local_800 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x13d;
  file_04.m_begin = (iterator)&local_7f8;
  msg_04.m_end = pvVar5;
  msg_04.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_808,
             msg_04);
  local_718.m_message.px = (element_type *)((ulong)local_718.m_message.px & 0xffffffffffffff00);
  local_718._0_8_ = &PTR__lazy_ostream_013abb30;
  local_718.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_700 = (path **)0xf6cf21;
  local_3c8._0_8_ = local_3c8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"-dir","");
  local_3e8._M_allocated_capacity = 0;
  local_3e8._8_8_ = 0;
  local_3f8._0_8_ =
       (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
        )0x0;
  local_3f8._8_8_ = 0;
  local_3d8._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path((path *)local_3f8);
  arg_04._M_string_length = in_stack_fffffffffffff560;
  arg_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff558;
  arg_04.field_2._M_allocated_capacity = in_stack_fffffffffffff568;
  arg_04.field_2._8_8_ = in_stack_fffffffffffff570;
  ArgsManager::GetPathArg((path *)&relative_path.super_path,&local_args,arg_04,(path *)local_3c8);
  iVar3 = std::filesystem::__cxx11::path::compare(&relative_path.super_path);
  local_740.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar3 == 0);
  local_740.m_message.px = (element_type *)0x0;
  local_740.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a28._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_a28.m_message.px = (element_type *)0xe9616d;
  uStack_520 = uStack_520 & 0xffffffffffffff00;
  local_548._32_8_ = &PTR__lazy_ostream_013ac130;
  local_518 = boost::unit_test::lazy_ostream::inst;
  pppStack_510 = (path **)&local_6e8;
  local_638 = &local_6f8;
  local_650[8] = false;
  local_650._0_8_ = &PTR__lazy_ostream_013ac130;
  local_640 = boost::unit_test::lazy_ostream::inst;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_6f8 = &absolute_path.super_path;
  local_6e8._0_8_ = &relative_path.super_path;
  boost::test_tools::tt_detail::report_assertion
            (&local_740,(lazy_ostream *)&local_718,1,2,REQUIRE,0xe96581,(size_t)&local_a28,0x13d,
             local_548 + 0x20,"absolute_path",local_650);
  boost::detail::shared_count::~shared_count(&local_740.m_message.pn);
  std::filesystem::__cxx11::path::~path(&relative_path.super_path);
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  if ((undefined1 *)local_3c8._0_8_ != local_3c8 + 0x10) {
    operator_delete((void *)local_3c8._0_8_,local_3c8._16_8_ + 1);
  }
  relative_path.super_path._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&relative_path,"-dir=/root/../home/user/.bitcoin","");
  ResetArgs(&local_args,(string *)&relative_path);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)relative_path.super_path._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(relative_path.super_path._M_pathname._M_dataplus._M_p,
                    relative_path.super_path._M_pathname.field_2._M_allocated_capacity + 1);
  }
  local_818 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_810 = "";
  local_828 = &boost::unit_test::basic_cstring<char_const>::null;
  local_820 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x140;
  file_05.m_begin = (iterator)&local_818;
  msg_05.m_end = pvVar5;
  msg_05.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_828,
             msg_05);
  local_718.m_message.px = (element_type *)((ulong)local_718.m_message.px & 0xffffffffffffff00);
  local_718._0_8_ = &PTR__lazy_ostream_013abb30;
  local_718.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_700 = (path **)0xf6cf21;
  local_418._0_8_ = (long)local_418 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"-dir","");
  local_3e8._M_allocated_capacity = 0;
  local_3e8._8_8_ = 0;
  local_3f8._0_8_ =
       (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
        )0x0;
  local_3f8._8_8_ = 0;
  local_3d8._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path((path *)local_3f8);
  arg_05._M_string_length = in_stack_fffffffffffff560;
  arg_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff558;
  arg_05.field_2._M_allocated_capacity = in_stack_fffffffffffff568;
  arg_05.field_2._8_8_ = in_stack_fffffffffffff570;
  ArgsManager::GetPathArg((path *)&relative_path.super_path,&local_args,arg_05,(path *)local_418);
  iVar3 = std::filesystem::__cxx11::path::compare(&relative_path.super_path);
  local_740.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar3 == 0);
  local_740.m_message.px = (element_type *)0x0;
  local_740.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a28._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_a28.m_message.px = (element_type *)0xe9616d;
  uStack_520 = uStack_520 & 0xffffffffffffff00;
  local_548._32_8_ = &PTR__lazy_ostream_013ac130;
  local_518 = boost::unit_test::lazy_ostream::inst;
  pppStack_510 = (path **)&local_6e8;
  local_650[8] = false;
  local_650._0_8_ = &PTR__lazy_ostream_013ac130;
  local_640 = boost::unit_test::lazy_ostream::inst;
  local_638 = &local_6f8;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_6f8 = &absolute_path.super_path;
  local_6e8._0_8_ = &relative_path.super_path;
  boost::test_tools::tt_detail::report_assertion
            (&local_740,(lazy_ostream *)&local_718,1,2,REQUIRE,0xe96581,(size_t)&local_a28,0x140,
             local_548 + 0x20,"absolute_path",local_650);
  boost::detail::shared_count::~shared_count(&local_740.m_message.pn);
  std::filesystem::__cxx11::path::~path(&relative_path.super_path);
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  if (local_418._0_8_ != (long)local_418 + 0x10) {
    operator_delete((void *)local_418._0_8_,local_418._16_8_ + 1);
  }
  relative_path.super_path._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&relative_path,"-dir=/home/./user/.bitcoin","");
  ResetArgs(&local_args,(string *)&relative_path);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)relative_path.super_path._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(relative_path.super_path._M_pathname._M_dataplus._M_p,
                    relative_path.super_path._M_pathname.field_2._M_allocated_capacity + 1);
  }
  local_838 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_830 = "";
  local_848 = &boost::unit_test::basic_cstring<char_const>::null;
  local_840 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x143;
  file_06.m_begin = (iterator)&local_838;
  msg_06.m_end = pvVar5;
  msg_06.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_848,
             msg_06);
  local_718.m_message.px = (element_type *)((ulong)local_718.m_message.px & 0xffffffffffffff00);
  local_718._0_8_ = &PTR__lazy_ostream_013abb30;
  local_718.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_700 = (path **)0xf6cf21;
  local_438._0_8_ = (long)local_438 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"-dir","");
  local_3e8._M_allocated_capacity = 0;
  local_3e8._8_8_ = 0;
  local_3f8._0_8_ =
       (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
        )0x0;
  local_3f8._8_8_ = 0;
  local_3d8._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path((path *)local_3f8);
  arg_06._M_string_length = in_stack_fffffffffffff560;
  arg_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffff558;
  arg_06.field_2._M_allocated_capacity = in_stack_fffffffffffff568;
  arg_06.field_2._8_8_ = in_stack_fffffffffffff570;
  ArgsManager::GetPathArg((path *)&relative_path.super_path,&local_args,arg_06,(path *)local_438);
  iVar3 = std::filesystem::__cxx11::path::compare(&relative_path.super_path);
  local_740.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar3 == 0);
  local_740.m_message.px = (element_type *)0x0;
  local_740.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a28._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_a28.m_message.px = (element_type *)0xe9616d;
  uStack_520 = uStack_520 & 0xffffffffffffff00;
  local_548._32_8_ = &PTR__lazy_ostream_013ac130;
  local_518 = boost::unit_test::lazy_ostream::inst;
  pppStack_510 = (path **)&local_6e8;
  local_650[8] = false;
  local_650._0_8_ = &PTR__lazy_ostream_013ac130;
  local_640 = boost::unit_test::lazy_ostream::inst;
  local_638 = &local_6f8;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_6f8 = &absolute_path.super_path;
  local_6e8._0_8_ = &relative_path.super_path;
  boost::test_tools::tt_detail::report_assertion
            (&local_740,(lazy_ostream *)&local_718,1,2,REQUIRE,0xe96581,(size_t)&local_a28,0x143,
             local_548 + 0x20,"absolute_path",local_650);
  boost::detail::shared_count::~shared_count(&local_740.m_message.pn);
  std::filesystem::__cxx11::path::~path(&relative_path.super_path);
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  if (local_438._0_8_ != (long)local_438 + 0x10) {
    operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
  }
  relative_path.super_path._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&relative_path,"-dir=/home/user/.bitcoin/","");
  ResetArgs(&local_args,(string *)&relative_path);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)relative_path.super_path._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(relative_path.super_path._M_pathname._M_dataplus._M_p,
                    relative_path.super_path._M_pathname.field_2._M_allocated_capacity + 1);
  }
  local_858 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_850 = "";
  local_868 = &boost::unit_test::basic_cstring<char_const>::null;
  local_860 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x146;
  file_07.m_begin = (iterator)&local_858;
  msg_07.m_end = pvVar5;
  msg_07.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_868,
             msg_07);
  local_718.m_message.px = (element_type *)((ulong)local_718.m_message.px & 0xffffffffffffff00);
  local_718._0_8_ = &PTR__lazy_ostream_013abb30;
  local_718.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_700 = (path **)0xf6cf21;
  local_458._0_8_ = (long)local_458 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"-dir","");
  local_3e8._M_allocated_capacity = 0;
  local_3e8._8_8_ = 0;
  local_3f8._0_8_ =
       (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
        )0x0;
  local_3f8._8_8_ = 0;
  local_3d8._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path((path *)local_3f8);
  arg_07._M_string_length = in_stack_fffffffffffff560;
  arg_07._M_dataplus._M_p = (pointer)in_stack_fffffffffffff558;
  arg_07.field_2._M_allocated_capacity = in_stack_fffffffffffff568;
  arg_07.field_2._8_8_ = in_stack_fffffffffffff570;
  ArgsManager::GetPathArg((path *)&relative_path.super_path,&local_args,arg_07,(path *)local_458);
  iVar3 = std::filesystem::__cxx11::path::compare(&relative_path.super_path);
  local_740.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar3 == 0);
  local_740.m_message.px = (element_type *)0x0;
  local_740.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a28._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_a28.m_message.px = (element_type *)0xe9616d;
  uStack_520 = uStack_520 & 0xffffffffffffff00;
  local_548._32_8_ = &PTR__lazy_ostream_013ac130;
  local_518 = boost::unit_test::lazy_ostream::inst;
  pppStack_510 = (path **)&local_6e8;
  local_650[8] = false;
  local_650._0_8_ = &PTR__lazy_ostream_013ac130;
  local_640 = boost::unit_test::lazy_ostream::inst;
  local_638 = &local_6f8;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_6f8 = &absolute_path.super_path;
  local_6e8._0_8_ = &relative_path.super_path;
  boost::test_tools::tt_detail::report_assertion
            (&local_740,(lazy_ostream *)&local_718,1,2,REQUIRE,0xe96581,(size_t)&local_a28,0x146,
             local_548 + 0x20,"absolute_path",local_650);
  boost::detail::shared_count::~shared_count(&local_740.m_message.pn);
  std::filesystem::__cxx11::path::~path(&relative_path.super_path);
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  if (local_458._0_8_ != (long)local_458 + 0x10) {
    operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
  }
  relative_path.super_path._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&relative_path,"-dir=/home/user/.bitcoin//","");
  ResetArgs(&local_args,(string *)&relative_path);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)relative_path.super_path._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(relative_path.super_path._M_pathname._M_dataplus._M_p,
                    relative_path.super_path._M_pathname.field_2._M_allocated_capacity + 1);
  }
  local_878 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_870 = "";
  local_888 = &boost::unit_test::basic_cstring<char_const>::null;
  local_880 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x149;
  file_08.m_begin = (iterator)&local_878;
  msg_08.m_end = pvVar5;
  msg_08.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_888,
             msg_08);
  local_718.m_message.px = (element_type *)((ulong)local_718.m_message.px & 0xffffffffffffff00);
  local_718._0_8_ = &PTR__lazy_ostream_013abb30;
  local_718.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_700 = (path **)0xf6cf21;
  local_478._0_8_ = (long)local_478 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"-dir","");
  local_3e8._M_allocated_capacity = 0;
  local_3e8._8_8_ = 0;
  local_3f8._0_8_ =
       (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
        )0x0;
  local_3f8._8_8_ = 0;
  local_3d8._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path((path *)local_3f8);
  arg_08._M_string_length = in_stack_fffffffffffff560;
  arg_08._M_dataplus._M_p = (pointer)in_stack_fffffffffffff558;
  arg_08.field_2._M_allocated_capacity = in_stack_fffffffffffff568;
  arg_08.field_2._8_8_ = in_stack_fffffffffffff570;
  ArgsManager::GetPathArg((path *)&relative_path.super_path,&local_args,arg_08,(path *)local_478);
  iVar3 = std::filesystem::__cxx11::path::compare(&relative_path.super_path);
  local_740.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar3 == 0);
  local_740.m_message.px = (element_type *)0x0;
  local_740.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a28._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_a28.m_message.px = (element_type *)0xe9616d;
  uStack_520 = uStack_520 & 0xffffffffffffff00;
  local_548._32_8_ = &PTR__lazy_ostream_013ac130;
  local_518 = boost::unit_test::lazy_ostream::inst;
  pppStack_510 = (path **)&local_6e8;
  local_650[8] = false;
  local_650._0_8_ = &PTR__lazy_ostream_013ac130;
  local_640 = boost::unit_test::lazy_ostream::inst;
  local_638 = &local_6f8;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_6f8 = &absolute_path.super_path;
  local_6e8._0_8_ = &relative_path.super_path;
  boost::test_tools::tt_detail::report_assertion
            (&local_740,(lazy_ostream *)&local_718,1,2,REQUIRE,0xe96581,(size_t)&local_a28,0x149,
             local_548 + 0x20,"absolute_path",local_650);
  boost::detail::shared_count::~shared_count(&local_740.m_message.pn);
  std::filesystem::__cxx11::path::~path(&relative_path.super_path);
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  if (local_478._0_8_ != (long)local_478 + 0x10) {
    operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
  }
  relative_path.super_path._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&relative_path,"-dir=/home/user/.bitcoin/.","");
  ResetArgs(&local_args,(string *)&relative_path);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)relative_path.super_path._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(relative_path.super_path._M_pathname._M_dataplus._M_p,
                    relative_path.super_path._M_pathname.field_2._M_allocated_capacity + 1);
  }
  local_898 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_890 = "";
  local_8a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x14c;
  file_09.m_begin = (iterator)&local_898;
  msg_09.m_end = pvVar5;
  msg_09.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_8a8,
             msg_09);
  local_718.m_message.px = (element_type *)((ulong)local_718.m_message.px & 0xffffffffffffff00);
  local_718._0_8_ = &PTR__lazy_ostream_013abb30;
  local_718.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_700 = (path **)0xf6cf21;
  local_498._0_8_ = (long)local_498 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"-dir","");
  local_3e8._M_allocated_capacity = 0;
  local_3e8._8_8_ = 0;
  local_3f8._0_8_ =
       (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
        )0x0;
  local_3f8._8_8_ = 0;
  local_3d8._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path((path *)local_3f8);
  arg_09._M_string_length = in_stack_fffffffffffff560;
  arg_09._M_dataplus._M_p = (pointer)in_stack_fffffffffffff558;
  arg_09.field_2._M_allocated_capacity = in_stack_fffffffffffff568;
  arg_09.field_2._8_8_ = in_stack_fffffffffffff570;
  ArgsManager::GetPathArg((path *)&relative_path.super_path,&local_args,arg_09,(path *)local_498);
  iVar3 = std::filesystem::__cxx11::path::compare(&relative_path.super_path);
  local_740.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar3 == 0);
  local_740.m_message.px = (element_type *)0x0;
  local_740.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a28._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_a28.m_message.px = (element_type *)0xe9616d;
  uStack_520 = uStack_520 & 0xffffffffffffff00;
  local_548._32_8_ = &PTR__lazy_ostream_013ac130;
  local_518 = boost::unit_test::lazy_ostream::inst;
  pppStack_510 = (path **)&local_6e8;
  local_650[8] = false;
  local_650._0_8_ = &PTR__lazy_ostream_013ac130;
  local_640 = boost::unit_test::lazy_ostream::inst;
  local_638 = &local_6f8;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_6f8 = &absolute_path.super_path;
  local_6e8._0_8_ = &relative_path.super_path;
  boost::test_tools::tt_detail::report_assertion
            (&local_740,(lazy_ostream *)&local_718,1,2,REQUIRE,0xe96581,(size_t)&local_a28,0x14c,
             local_548 + 0x20,"absolute_path",local_650);
  boost::detail::shared_count::~shared_count(&local_740.m_message.pn);
  std::filesystem::__cxx11::path::~path(&relative_path.super_path);
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  if (local_498._0_8_ != (long)local_498 + 0x10) {
    operator_delete((void *)local_498._0_8_,local_498._16_8_ + 1);
  }
  relative_path.super_path._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&relative_path,"-dir=/home/user/.bitcoin/./","");
  ResetArgs(&local_args,(string *)&relative_path);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)relative_path.super_path._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(relative_path.super_path._M_pathname._M_dataplus._M_p,
                    relative_path.super_path._M_pathname.field_2._M_allocated_capacity + 1);
  }
  local_8b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_8b0 = "";
  local_8c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x14f;
  file_10.m_begin = (iterator)&local_8b8;
  msg_10.m_end = pvVar5;
  msg_10.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_8c8,
             msg_10);
  local_718.m_message.px = (element_type *)((ulong)local_718.m_message.px & 0xffffffffffffff00);
  local_718._0_8_ = &PTR__lazy_ostream_013abb30;
  local_718.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_700 = (path **)0xf6cf21;
  local_4b8._0_8_ = (long)local_4b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4b8,"-dir","");
  local_3e8._M_allocated_capacity = 0;
  local_3e8._8_8_ = 0;
  local_3f8._0_8_ =
       (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
        )0x0;
  local_3f8._8_8_ = 0;
  local_3d8._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path((path *)local_3f8);
  arg_10._M_string_length = in_stack_fffffffffffff560;
  arg_10._M_dataplus._M_p = (pointer)in_stack_fffffffffffff558;
  arg_10.field_2._M_allocated_capacity = in_stack_fffffffffffff568;
  arg_10.field_2._8_8_ = in_stack_fffffffffffff570;
  ArgsManager::GetPathArg((path *)&relative_path.super_path,&local_args,arg_10,(path *)local_4b8);
  iVar3 = std::filesystem::__cxx11::path::compare(&relative_path.super_path);
  local_740.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar3 == 0);
  local_740.m_message.px = (element_type *)0x0;
  local_740.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a28._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_a28.m_message.px = (element_type *)0xe9616d;
  uStack_520 = uStack_520 & 0xffffffffffffff00;
  local_548._32_8_ = &PTR__lazy_ostream_013ac130;
  local_518 = boost::unit_test::lazy_ostream::inst;
  pppStack_510 = (path **)&local_6e8;
  local_650[8] = false;
  local_650._0_8_ = &PTR__lazy_ostream_013ac130;
  local_640 = boost::unit_test::lazy_ostream::inst;
  local_638 = &local_6f8;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_6f8 = &absolute_path.super_path;
  local_6e8._0_8_ = &relative_path.super_path;
  boost::test_tools::tt_detail::report_assertion
            (&local_740,(lazy_ostream *)&local_718,1,2,REQUIRE,0xe96581,(size_t)&local_a28,0x14f,
             local_548 + 0x20,"absolute_path",local_650);
  boost::detail::shared_count::~shared_count(&local_740.m_message.pn);
  std::filesystem::__cxx11::path::~path(&relative_path.super_path);
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  if (local_4b8._0_8_ != (long)local_4b8 + 0x10) {
    operator_delete((void *)local_4b8._0_8_,local_4b8._16_8_ + 1);
  }
  relative_path.super_path._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&relative_path,"-dir=/home/user/.bitcoin/.//","");
  ResetArgs(&local_args,(string *)&relative_path);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)relative_path.super_path._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(relative_path.super_path._M_pathname._M_dataplus._M_p,
                    relative_path.super_path._M_pathname.field_2._M_allocated_capacity + 1);
  }
  local_8d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_8d0 = "";
  local_8e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x152;
  file_11.m_begin = (iterator)&local_8d8;
  msg_11.m_end = pvVar5;
  msg_11.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_8e8,
             msg_11);
  local_718.m_message.px = (element_type *)((ulong)local_718.m_message.px & 0xffffffffffffff00);
  local_718._0_8_ = &PTR__lazy_ostream_013abb30;
  local_718.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_700 = (path **)0xf6cf21;
  local_4d8._0_8_ = (long)local_4d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4d8,"-dir","");
  local_3e8._M_allocated_capacity = 0;
  local_3e8._8_8_ = 0;
  local_3f8._0_8_ =
       (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
        )0x0;
  local_3f8._8_8_ = 0;
  local_3d8._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path((path *)local_3f8);
  arg_11._M_string_length = in_stack_fffffffffffff560;
  arg_11._M_dataplus._M_p = (pointer)in_stack_fffffffffffff558;
  arg_11.field_2._M_allocated_capacity = in_stack_fffffffffffff568;
  arg_11.field_2._8_8_ = in_stack_fffffffffffff570;
  ArgsManager::GetPathArg((path *)&relative_path.super_path,&local_args,arg_11,(path *)local_4d8);
  iVar3 = std::filesystem::__cxx11::path::compare(&relative_path.super_path);
  local_740.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar3 == 0);
  local_740.m_message.px = (element_type *)0x0;
  local_740.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a28._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_a28.m_message.px = (element_type *)0xe9616d;
  uStack_520 = uStack_520 & 0xffffffffffffff00;
  local_548._32_8_ = &PTR__lazy_ostream_013ac130;
  local_518 = boost::unit_test::lazy_ostream::inst;
  pppStack_510 = (path **)&local_6e8;
  local_650[8] = false;
  local_650._0_8_ = &PTR__lazy_ostream_013ac130;
  local_640 = boost::unit_test::lazy_ostream::inst;
  local_638 = &local_6f8;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_6f8 = &absolute_path.super_path;
  local_6e8._0_8_ = &relative_path.super_path;
  boost::test_tools::tt_detail::report_assertion
            (&local_740,(lazy_ostream *)&local_718,1,2,REQUIRE,0xe96581,(size_t)&local_a28,0x152,
             local_548 + 0x20,"absolute_path",local_650);
  boost::detail::shared_count::~shared_count(&local_740.m_message.pn);
  std::filesystem::__cxx11::path::~path(&relative_path.super_path);
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  if (local_4d8._0_8_ != (long)local_4d8 + 0x10) {
    operator_delete((void *)local_4d8._0_8_,local_4d8._16_8_ + 1);
  }
  local_3f8._0_8_ = (long)"-dir=somewhere/../user/.bitcoin" + 0x12;
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&relative_path.super_path,(char **)local_3f8,auto_format);
  local_3f8._0_8_ = &local_3e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"-dir=user/.bitcoin","");
  ResetArgs(&local_args,(string *)local_3f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._0_8_ != &local_3e8) {
    operator_delete((void *)local_3f8._0_8_,local_3e8._M_allocated_capacity + 1);
  }
  local_8f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_8f0 = "";
  local_908 = &boost::unit_test::basic_cstring<char_const>::null;
  local_900 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x156;
  file_12.m_begin = (iterator)&local_8f8;
  msg_12.m_end = pvVar5;
  msg_12.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_908,
             msg_12);
  local_740.m_message.px = (element_type *)((ulong)local_740.m_message.px & 0xffffffffffffff00);
  local_740._0_8_ = &PTR__lazy_ostream_013abb30;
  local_740.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_728 = (path **)0xf6cf21;
  local_4f8._0_8_ = local_4f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4f8,"-dir","");
  local_518 = (undefined1 *)0x0;
  pppStack_510 = (path **)0x0;
  local_548._32_8_ =
       (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
        )0x0;
  uStack_520 = 0;
  local_508 = 0;
  std::filesystem::__cxx11::path::path((path *)(local_548 + 0x20));
  arg_12._M_string_length = in_stack_fffffffffffff560;
  arg_12._M_dataplus._M_p = (pointer)in_stack_fffffffffffff558;
  arg_12.field_2._M_allocated_capacity = in_stack_fffffffffffff568;
  arg_12.field_2._8_8_ = in_stack_fffffffffffff570;
  ArgsManager::GetPathArg((path *)local_3f8,&local_args,arg_12,(path *)local_4f8);
  iVar3 = std::filesystem::__cxx11::path::compare((path *)local_3f8);
  local_a28.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar3 == 0);
  local_a28.m_message.px = (element_type *)0x0;
  local_a28.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_6e8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_6e8.m_message.px = (element_type *)0xe9616d;
  local_650[8] = false;
  local_650._0_8_ = &PTR__lazy_ostream_013ac130;
  local_640 = boost::unit_test::lazy_ostream::inst;
  local_638 = &local_6f8;
  local_700 = &local_720;
  local_718.m_message.px = (element_type *)((ulong)local_718.m_message.px & 0xffffffffffffff00);
  local_718._0_8_ = &PTR__lazy_ostream_013ac130;
  local_718.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_720 = &relative_path.super_path;
  local_6f8 = (path *)local_3f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_a28,(lazy_ostream *)&local_740,1,2,REQUIRE,0xe96581,(size_t)&local_6e8,0x156,
             local_650,"relative_path",&local_718);
  boost::detail::shared_count::~shared_count(&local_a28.m_message.pn);
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  std::filesystem::__cxx11::path::~path((path *)(local_548 + 0x20));
  if ((undefined1 *)local_4f8._0_8_ != local_4f8 + 0x10) {
    operator_delete((void *)local_4f8._0_8_,local_4f8._16_8_ + 1);
  }
  local_3f8._0_8_ = &local_3e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3f8,"-dir=somewhere/../user/.bitcoin","");
  ResetArgs(&local_args,(string *)local_3f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._0_8_ != &local_3e8) {
    operator_delete((void *)local_3f8._0_8_,local_3e8._M_allocated_capacity + 1);
  }
  local_918 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_910 = "";
  local_928 = &boost::unit_test::basic_cstring<char_const>::null;
  local_920 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x159;
  file_13.m_begin = (iterator)&local_918;
  msg_13.m_end = pvVar5;
  msg_13.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_928,
             msg_13);
  local_740.m_message.px = (element_type *)((ulong)local_740.m_message.px & 0xffffffffffffff00);
  local_740._0_8_ = &PTR__lazy_ostream_013abb30;
  local_740.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_728 = (path **)0xf6cf21;
  local_548._0_8_ = (long)local_548 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_548,"-dir","");
  local_518 = (undefined1 *)0x0;
  pppStack_510 = (path **)0x0;
  local_548._32_8_ =
       (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
        )0x0;
  uStack_520 = 0;
  local_508 = 0;
  std::filesystem::__cxx11::path::path((path *)(local_548 + 0x20));
  arg_13._M_string_length = in_stack_fffffffffffff560;
  arg_13._M_dataplus._M_p = (pointer)in_stack_fffffffffffff558;
  arg_13.field_2._M_allocated_capacity = in_stack_fffffffffffff568;
  arg_13.field_2._8_8_ = in_stack_fffffffffffff570;
  ArgsManager::GetPathArg((path *)local_3f8,&local_args,arg_13,(path *)local_548);
  iVar3 = std::filesystem::__cxx11::path::compare((path *)local_3f8);
  local_a28.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar3 == 0);
  local_a28.m_message.px = (element_type *)0x0;
  local_a28.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_6e8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_6e8.m_message.px = (element_type *)0xe9616d;
  local_650[8] = false;
  local_650._0_8_ = &PTR__lazy_ostream_013ac130;
  local_640 = boost::unit_test::lazy_ostream::inst;
  local_638 = &local_6f8;
  local_718.m_message.px = (element_type *)((ulong)local_718.m_message.px & 0xffffffffffffff00);
  local_718._0_8_ = &PTR__lazy_ostream_013ac130;
  local_718.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_700 = &local_720;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_720 = &relative_path.super_path;
  local_6f8 = (path *)local_3f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_a28,(lazy_ostream *)&local_740,1,2,REQUIRE,0xe96581,(size_t)&local_6e8,0x159,
             local_650,"relative_path",&local_718);
  boost::detail::shared_count::~shared_count(&local_a28.m_message.pn);
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  std::filesystem::__cxx11::path::~path((path *)(local_548 + 0x20));
  if (local_548._0_8_ != (long)local_548 + 0x10) {
    operator_delete((void *)local_548._0_8_,local_548._16_8_ + 1);
  }
  local_3f8._0_8_ = &local_3e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"-dir=user/./.bitcoin","");
  ResetArgs(&local_args,(string *)local_3f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._0_8_ != &local_3e8) {
    operator_delete((void *)local_3f8._0_8_,local_3e8._M_allocated_capacity + 1);
  }
  local_938 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_930 = "";
  local_948 = &boost::unit_test::basic_cstring<char_const>::null;
  local_940 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x15c;
  file_14.m_begin = (iterator)&local_938;
  msg_14.m_end = pvVar5;
  msg_14.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_948,
             msg_14);
  local_740.m_message.px = (element_type *)((ulong)local_740.m_message.px & 0xffffffffffffff00);
  local_740._0_8_ = &PTR__lazy_ostream_013abb30;
  local_740.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_728 = (path **)0xf6cf21;
  local_568._0_8_ = (long)local_568 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_568,"-dir","");
  local_518 = (undefined1 *)0x0;
  pppStack_510 = (path **)0x0;
  local_548._32_8_ =
       (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
        )0x0;
  uStack_520 = 0;
  local_508 = 0;
  std::filesystem::__cxx11::path::path((path *)(local_548 + 0x20));
  arg_14._M_string_length = in_stack_fffffffffffff560;
  arg_14._M_dataplus._M_p = (pointer)in_stack_fffffffffffff558;
  arg_14.field_2._M_allocated_capacity = in_stack_fffffffffffff568;
  arg_14.field_2._8_8_ = in_stack_fffffffffffff570;
  ArgsManager::GetPathArg((path *)local_3f8,&local_args,arg_14,(path *)local_568);
  iVar3 = std::filesystem::__cxx11::path::compare((path *)local_3f8);
  local_a28.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar3 == 0);
  local_a28.m_message.px = (element_type *)0x0;
  local_a28.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_6e8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_6e8.m_message.px = (element_type *)0xe9616d;
  local_650[8] = false;
  local_650._0_8_ = &PTR__lazy_ostream_013ac130;
  local_640 = boost::unit_test::lazy_ostream::inst;
  local_638 = &local_6f8;
  local_718.m_message.px = (element_type *)((ulong)local_718.m_message.px & 0xffffffffffffff00);
  local_718._0_8_ = &PTR__lazy_ostream_013ac130;
  local_718.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_700 = &local_720;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_720 = &relative_path.super_path;
  local_6f8 = (path *)local_3f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_a28,(lazy_ostream *)&local_740,1,2,REQUIRE,0xe96581,(size_t)&local_6e8,0x15c,
             local_650,"relative_path",&local_718);
  boost::detail::shared_count::~shared_count(&local_a28.m_message.pn);
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  std::filesystem::__cxx11::path::~path((path *)(local_548 + 0x20));
  if (local_568._0_8_ != (long)local_568 + 0x10) {
    operator_delete((void *)local_568._0_8_,local_568._16_8_ + 1);
  }
  local_3f8._0_8_ = &local_3e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"-dir=user/.bitcoin/","");
  ResetArgs(&local_args,(string *)local_3f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._0_8_ != &local_3e8) {
    operator_delete((void *)local_3f8._0_8_,local_3e8._M_allocated_capacity + 1);
  }
  local_958 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_950 = "";
  local_968 = &boost::unit_test::basic_cstring<char_const>::null;
  local_960 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x15f;
  file_15.m_begin = (iterator)&local_958;
  msg_15.m_end = pvVar5;
  msg_15.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_968,
             msg_15);
  local_740.m_message.px = (element_type *)((ulong)local_740.m_message.px & 0xffffffffffffff00);
  local_740._0_8_ = &PTR__lazy_ostream_013abb30;
  local_740.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_728 = (path **)0xf6cf21;
  local_588._0_8_ = (long)local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"-dir","");
  local_518 = (undefined1 *)0x0;
  pppStack_510 = (path **)0x0;
  local_548._32_8_ =
       (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
        )0x0;
  uStack_520 = 0;
  local_508 = 0;
  std::filesystem::__cxx11::path::path((path *)(local_548 + 0x20));
  arg_15._M_string_length = in_stack_fffffffffffff560;
  arg_15._M_dataplus._M_p = (pointer)in_stack_fffffffffffff558;
  arg_15.field_2._M_allocated_capacity = in_stack_fffffffffffff568;
  arg_15.field_2._8_8_ = in_stack_fffffffffffff570;
  ArgsManager::GetPathArg((path *)local_3f8,&local_args,arg_15,(path *)local_588);
  iVar3 = std::filesystem::__cxx11::path::compare((path *)local_3f8);
  local_a28.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar3 == 0);
  local_a28.m_message.px = (element_type *)0x0;
  local_a28.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_6e8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_6e8.m_message.px = (element_type *)0xe9616d;
  local_650[8] = false;
  local_650._0_8_ = &PTR__lazy_ostream_013ac130;
  local_640 = boost::unit_test::lazy_ostream::inst;
  local_638 = &local_6f8;
  local_718.m_message.px = (element_type *)((ulong)local_718.m_message.px & 0xffffffffffffff00);
  local_718._0_8_ = &PTR__lazy_ostream_013ac130;
  local_718.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_700 = &local_720;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_720 = &relative_path.super_path;
  local_6f8 = (path *)local_3f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_a28,(lazy_ostream *)&local_740,1,2,REQUIRE,0xe96581,(size_t)&local_6e8,0x15f,
             local_650,"relative_path",&local_718);
  boost::detail::shared_count::~shared_count(&local_a28.m_message.pn);
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  std::filesystem::__cxx11::path::~path((path *)(local_548 + 0x20));
  if (local_588._0_8_ != (long)local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  local_3f8._0_8_ = &local_3e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"-dir=user/.bitcoin//","");
  ResetArgs(&local_args,(string *)local_3f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._0_8_ != &local_3e8) {
    operator_delete((void *)local_3f8._0_8_,local_3e8._M_allocated_capacity + 1);
  }
  local_978 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_970 = "";
  local_988 = &boost::unit_test::basic_cstring<char_const>::null;
  local_980 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x162;
  file_16.m_begin = (iterator)&local_978;
  msg_16.m_end = pvVar5;
  msg_16.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_988,
             msg_16);
  local_740.m_message.px = (element_type *)((ulong)local_740.m_message.px & 0xffffffffffffff00);
  local_740._0_8_ = &PTR__lazy_ostream_013abb30;
  local_740.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_728 = (path **)0xf6cf21;
  local_5a8._0_8_ = (long)local_5a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5a8,"-dir","");
  local_518 = (undefined1 *)0x0;
  pppStack_510 = (path **)0x0;
  local_548._32_8_ =
       (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
        )0x0;
  uStack_520 = 0;
  local_508 = 0;
  std::filesystem::__cxx11::path::path((path *)(local_548 + 0x20));
  arg_16._M_string_length = in_stack_fffffffffffff560;
  arg_16._M_dataplus._M_p = (pointer)in_stack_fffffffffffff558;
  arg_16.field_2._M_allocated_capacity = in_stack_fffffffffffff568;
  arg_16.field_2._8_8_ = in_stack_fffffffffffff570;
  ArgsManager::GetPathArg((path *)local_3f8,&local_args,arg_16,(path *)local_5a8);
  iVar3 = std::filesystem::__cxx11::path::compare((path *)local_3f8);
  local_a28.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar3 == 0);
  local_a28.m_message.px = (element_type *)0x0;
  local_a28.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_6e8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_6e8.m_message.px = (element_type *)0xe9616d;
  local_650[8] = false;
  local_650._0_8_ = &PTR__lazy_ostream_013ac130;
  local_640 = boost::unit_test::lazy_ostream::inst;
  local_638 = &local_6f8;
  local_718.m_message.px = (element_type *)((ulong)local_718.m_message.px & 0xffffffffffffff00);
  local_718._0_8_ = &PTR__lazy_ostream_013ac130;
  local_718.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_700 = &local_720;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_720 = &relative_path.super_path;
  local_6f8 = (path *)local_3f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_a28,(lazy_ostream *)&local_740,1,2,REQUIRE,0xe96581,(size_t)&local_6e8,0x162,
             local_650,"relative_path",&local_718);
  boost::detail::shared_count::~shared_count(&local_a28.m_message.pn);
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  std::filesystem::__cxx11::path::~path((path *)(local_548 + 0x20));
  if (local_5a8._0_8_ != (long)local_5a8 + 0x10) {
    operator_delete((void *)local_5a8._0_8_,local_5a8._16_8_ + 1);
  }
  local_3f8._0_8_ = &local_3e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"-dir=user/.bitcoin/.","");
  ResetArgs(&local_args,(string *)local_3f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._0_8_ != &local_3e8) {
    operator_delete((void *)local_3f8._0_8_,local_3e8._M_allocated_capacity + 1);
  }
  local_998 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_990 = "";
  local_9a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x165;
  file_17.m_begin = (iterator)&local_998;
  msg_17.m_end = pvVar5;
  msg_17.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_9a8,
             msg_17);
  local_740.m_message.px = (element_type *)((ulong)local_740.m_message.px & 0xffffffffffffff00);
  local_740._0_8_ = &PTR__lazy_ostream_013abb30;
  local_740.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_728 = (path **)0xf6cf21;
  local_5c8._0_8_ = (long)local_5c8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c8,"-dir","");
  local_518 = (undefined1 *)0x0;
  pppStack_510 = (path **)0x0;
  local_548._32_8_ =
       (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
        )0x0;
  uStack_520 = 0;
  local_508 = 0;
  std::filesystem::__cxx11::path::path((path *)(local_548 + 0x20));
  arg_17._M_string_length = in_stack_fffffffffffff560;
  arg_17._M_dataplus._M_p = (pointer)in_stack_fffffffffffff558;
  arg_17.field_2._M_allocated_capacity = in_stack_fffffffffffff568;
  arg_17.field_2._8_8_ = in_stack_fffffffffffff570;
  ArgsManager::GetPathArg((path *)local_3f8,&local_args,arg_17,(path *)local_5c8);
  iVar3 = std::filesystem::__cxx11::path::compare((path *)local_3f8);
  local_a28.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar3 == 0);
  local_a28.m_message.px = (element_type *)0x0;
  local_a28.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_6e8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_6e8.m_message.px = (element_type *)0xe9616d;
  local_650[8] = false;
  local_650._0_8_ = &PTR__lazy_ostream_013ac130;
  local_640 = boost::unit_test::lazy_ostream::inst;
  local_638 = &local_6f8;
  local_718.m_message.px = (element_type *)((ulong)local_718.m_message.px & 0xffffffffffffff00);
  local_718._0_8_ = &PTR__lazy_ostream_013ac130;
  local_718.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_700 = &local_720;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_720 = &relative_path.super_path;
  local_6f8 = (path *)local_3f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_a28,(lazy_ostream *)&local_740,1,2,REQUIRE,0xe96581,(size_t)&local_6e8,0x165,
             local_650,"relative_path",&local_718);
  boost::detail::shared_count::~shared_count(&local_a28.m_message.pn);
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  std::filesystem::__cxx11::path::~path((path *)(local_548 + 0x20));
  if (local_5c8._0_8_ != (long)local_5c8 + 0x10) {
    operator_delete((void *)local_5c8._0_8_,local_5c8._16_8_ + 1);
  }
  local_3f8._0_8_ = &local_3e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"-dir=user/.bitcoin/./","");
  ResetArgs(&local_args,(string *)local_3f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._0_8_ != &local_3e8) {
    operator_delete((void *)local_3f8._0_8_,local_3e8._M_allocated_capacity + 1);
  }
  local_9b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_9b0 = "";
  local_9c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x168;
  file_18.m_begin = (iterator)&local_9b8;
  msg_18.m_end = pvVar5;
  msg_18.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_9c8,
             msg_18);
  local_740.m_message.px = (element_type *)((ulong)local_740.m_message.px & 0xffffffffffffff00);
  local_740._0_8_ = &PTR__lazy_ostream_013abb30;
  local_740.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_728 = (path **)0xf6cf21;
  local_5e8._0_8_ = (long)local_5e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e8,"-dir","");
  local_518 = (undefined1 *)0x0;
  pppStack_510 = (path **)0x0;
  local_548._32_8_ =
       (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
        )0x0;
  uStack_520 = 0;
  local_508 = 0;
  std::filesystem::__cxx11::path::path((path *)(local_548 + 0x20));
  arg_18._M_string_length = in_stack_fffffffffffff560;
  arg_18._M_dataplus._M_p = (pointer)in_stack_fffffffffffff558;
  arg_18.field_2._M_allocated_capacity = in_stack_fffffffffffff568;
  arg_18.field_2._8_8_ = in_stack_fffffffffffff570;
  ArgsManager::GetPathArg((path *)local_3f8,&local_args,arg_18,(path *)local_5e8);
  iVar3 = std::filesystem::__cxx11::path::compare((path *)local_3f8);
  local_a28.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar3 == 0);
  local_a28.m_message.px = (element_type *)0x0;
  local_a28.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_6e8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_6e8.m_message.px = (element_type *)0xe9616d;
  local_650[8] = false;
  local_650._0_8_ = &PTR__lazy_ostream_013ac130;
  local_640 = boost::unit_test::lazy_ostream::inst;
  local_638 = &local_6f8;
  local_718.m_message.px = (element_type *)((ulong)local_718.m_message.px & 0xffffffffffffff00);
  local_718._0_8_ = &PTR__lazy_ostream_013ac130;
  local_718.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_700 = &local_720;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_720 = &relative_path.super_path;
  local_6f8 = (path *)local_3f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_a28,(lazy_ostream *)&local_740,1,2,REQUIRE,0xe96581,(size_t)&local_6e8,0x168,
             local_650,"relative_path",&local_718);
  boost::detail::shared_count::~shared_count(&local_a28.m_message.pn);
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  std::filesystem::__cxx11::path::~path((path *)(local_548 + 0x20));
  if (local_5e8._0_8_ != (long)local_5e8 + 0x10) {
    operator_delete((void *)local_5e8._0_8_,local_5e8._16_8_ + 1);
  }
  local_3f8._0_8_ = &local_3e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"-dir=user/.bitcoin/.//","");
  ResetArgs(&local_args,(string *)local_3f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._0_8_ != &local_3e8) {
    operator_delete((void *)local_3f8._0_8_,local_3e8._M_allocated_capacity + 1);
  }
  local_9d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_9d0 = "";
  local_9e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x16b;
  file_19.m_begin = (iterator)&local_9d8;
  msg_19.m_end = pvVar5;
  msg_19.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_9e8,
             msg_19);
  local_740.m_message.px = (element_type *)((ulong)local_740.m_message.px & 0xffffffffffffff00);
  local_740._0_8_ = &PTR__lazy_ostream_013abb30;
  local_740.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_728 = (path **)0xf6cf21;
  local_608._0_8_ = (long)local_608 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"-dir","");
  local_518 = (undefined1 *)0x0;
  pppStack_510 = (path **)0x0;
  local_548._32_8_ =
       (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
        )0x0;
  uStack_520 = 0;
  local_508 = 0;
  std::filesystem::__cxx11::path::path((path *)(local_548 + 0x20));
  arg_19._M_string_length = in_stack_fffffffffffff560;
  arg_19._M_dataplus._M_p = (pointer)in_stack_fffffffffffff558;
  arg_19.field_2._M_allocated_capacity = in_stack_fffffffffffff568;
  arg_19.field_2._8_8_ = in_stack_fffffffffffff570;
  ArgsManager::GetPathArg((path *)local_3f8,&local_args,arg_19,(path *)local_608);
  iVar3 = std::filesystem::__cxx11::path::compare((path *)local_3f8);
  local_a28.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar3 == 0);
  local_a28.m_message.px = (element_type *)0x0;
  local_a28.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_6e8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_6e8.m_message.px = (element_type *)0xe9616d;
  local_650[8] = false;
  local_650._0_8_ = &PTR__lazy_ostream_013ac130;
  local_640 = boost::unit_test::lazy_ostream::inst;
  local_638 = &local_6f8;
  local_718.m_message.px = (element_type *)((ulong)local_718.m_message.px & 0xffffffffffffff00);
  local_718._0_8_ = &PTR__lazy_ostream_013ac130;
  local_718.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_700 = &local_720;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_720 = &relative_path.super_path;
  local_6f8 = (path *)local_3f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_a28,(lazy_ostream *)&local_740,1,2,REQUIRE,0xe96581,(size_t)&local_6e8,0x16b,
             local_650,"relative_path",&local_718);
  boost::detail::shared_count::~shared_count(&local_a28.m_message.pn);
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  std::filesystem::__cxx11::path::~path((path *)(local_548 + 0x20));
  if (local_608._0_8_ != (long)local_608 + 0x10) {
    operator_delete((void *)local_608._0_8_,local_608._16_8_ + 1);
  }
  local_3f8._0_8_ = &local_3e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"");
  ResetArgs(&local_args,(string *)local_3f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._0_8_ != &local_3e8) {
    operator_delete((void *)local_3f8._0_8_,local_3e8._M_allocated_capacity + 1);
  }
  local_9f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_9f0 = "";
  local_a08 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a00 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x175;
  file_20.m_begin = (iterator)&local_9f8;
  msg_20.m_end = pvVar5;
  msg_20.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_a08,
             msg_20);
  local_a28.m_message.px = (element_type *)((ulong)local_a28.m_message.px & 0xffffffffffffff00);
  local_a28._0_8_ = &PTR__lazy_ostream_013abb30;
  local_a28.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_a10 = "";
  local_628._0_8_ = local_628 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_628,"-dir","");
  local_650._0_8_ = (long)"wallet default" + 7;
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            ((path *)(local_548 + 0x20),(char **)local_650,auto_format);
  arg_20._M_string_length = in_stack_fffffffffffff560;
  arg_20._M_dataplus._M_p = (pointer)in_stack_fffffffffffff558;
  arg_20.field_2._M_allocated_capacity = in_stack_fffffffffffff568;
  arg_20.field_2._8_8_ = in_stack_fffffffffffff570;
  ArgsManager::GetPathArg((path *)local_3f8,&local_args,arg_20,(path *)local_628);
  local_718._0_8_ = "default";
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            ((path *)local_650,(char **)&local_718,auto_format);
  iVar3 = std::filesystem::__cxx11::path::compare((path *)local_3f8);
  local_6e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar3 == 0);
  local_6e8.m_message.px = (element_type *)0x0;
  local_6e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_6f8 = (path *)0xe96108;
  local_6f0 = "";
  local_718.m_message.px = (element_type *)((ulong)local_718.m_message.px & 0xffffffffffffff00);
  local_718._0_8_ = &PTR__lazy_ostream_013ac130;
  local_718.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_700 = &local_720;
  local_728 = &local_748;
  local_740.m_message.px = (element_type *)((ulong)local_740.m_message.px & 0xffffffffffffff00);
  local_740._0_8_ = &PTR__lazy_ostream_013ac130;
  local_740.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_748 = (path *)local_650;
  local_720 = (path *)local_3f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_6e8,(lazy_ostream *)&local_a28,1,2,REQUIRE,0xe96783,(size_t)&local_6f8,0x175,
             &local_718,"fs::path{\"default\"}",&local_740);
  boost::detail::shared_count::~shared_count(&local_6e8.m_message.pn);
  std::filesystem::__cxx11::path::~path((path *)local_650);
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  std::filesystem::__cxx11::path::~path((path *)(local_548 + 0x20));
  if ((undefined1 *)local_628._0_8_ != local_628 + 0x10) {
    operator_delete((void *)local_628._0_8_,local_628._16_8_ + 1);
  }
  local_3f8._0_8_ = &local_3e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"-dir=override","");
  ResetArgs(&local_args,(string *)local_3f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._0_8_ != &local_3e8) {
    operator_delete((void *)local_3f8._0_8_,local_3e8._M_allocated_capacity + 1);
  }
  local_a38 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_a30 = "";
  local_a48 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a40 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x177;
  file_21.m_begin = (iterator)&local_a38;
  msg_21.m_end = pvVar5;
  msg_21.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_a48,
             msg_21);
  local_a28.m_message.px = (element_type *)((ulong)local_a28.m_message.px & 0xffffffffffffff00);
  local_a28._0_8_ = &PTR__lazy_ostream_013abb30;
  local_a28.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_a10 = "";
  local_670._0_8_ = (long)local_670 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_670,"-dir","");
  local_650._0_8_ = (long)"wallet default" + 7;
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            ((path *)(local_548 + 0x20),(char **)local_650,auto_format);
  arg_21._M_string_length = in_stack_fffffffffffff560;
  arg_21._M_dataplus._M_p = (pointer)in_stack_fffffffffffff558;
  arg_21.field_2._M_allocated_capacity = in_stack_fffffffffffff568;
  arg_21.field_2._8_8_ = in_stack_fffffffffffff570;
  ArgsManager::GetPathArg((path *)local_3f8,&local_args,arg_21,(path *)local_670);
  local_718._0_8_ = "override";
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            ((path *)local_650,(char **)&local_718,auto_format);
  iVar3 = std::filesystem::__cxx11::path::compare((path *)local_3f8);
  local_6e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar3 == 0);
  local_6e8.m_message.px = (element_type *)0x0;
  local_6e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_6f8 = (path *)0xe96108;
  local_6f0 = "";
  local_718.m_message.px = (element_type *)((ulong)local_718.m_message.px & 0xffffffffffffff00);
  local_718._0_8_ = &PTR__lazy_ostream_013ac130;
  local_718.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_700 = &local_720;
  local_740.m_message.px = (element_type *)((ulong)local_740.m_message.px & 0xffffffffffffff00);
  local_740._0_8_ = &PTR__lazy_ostream_013ac130;
  local_740.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_728 = &local_748;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_748 = (path *)local_650;
  local_720 = (path *)local_3f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_6e8,(lazy_ostream *)&local_a28,1,2,REQUIRE,0xe96783,(size_t)&local_6f8,0x177,
             &local_718,"fs::path{\"override\"}",&local_740);
  boost::detail::shared_count::~shared_count(&local_6e8.m_message.pn);
  std::filesystem::__cxx11::path::~path((path *)local_650);
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  std::filesystem::__cxx11::path::~path((path *)(local_548 + 0x20));
  if (local_670._0_8_ != (long)local_670 + 0x10) {
    operator_delete((void *)local_670._0_8_,local_670._16_8_ + 1);
  }
  local_3f8._0_8_ = &local_3e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"-dir=","");
  ResetArgs(&local_args,(string *)local_3f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._0_8_ != &local_3e8) {
    operator_delete((void *)local_3f8._0_8_,local_3e8._M_allocated_capacity + 1);
  }
  local_a58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_a50 = "";
  local_a68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a60 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x179;
  file_22.m_begin = (iterator)&local_a58;
  msg_22.m_end = pvVar5;
  msg_22.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_a68,
             msg_22);
  local_a28.m_message.px = (element_type *)((ulong)local_a28.m_message.px & 0xffffffffffffff00);
  local_a28._0_8_ = &PTR__lazy_ostream_013abb30;
  local_a28.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_a10 = "";
  local_690._0_8_ = (long)local_690 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_690,"-dir","");
  local_650._0_8_ = (long)"wallet default" + 7;
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            ((path *)(local_548 + 0x20),(char **)local_650,auto_format);
  arg_22._M_string_length = in_stack_fffffffffffff560;
  arg_22._M_dataplus._M_p = (pointer)in_stack_fffffffffffff558;
  arg_22.field_2._M_allocated_capacity = in_stack_fffffffffffff568;
  arg_22.field_2._8_8_ = in_stack_fffffffffffff570;
  ArgsManager::GetPathArg((path *)local_3f8,&local_args,arg_22,(path *)local_690);
  local_718._0_8_ = "default";
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            ((path *)local_650,(char **)&local_718,auto_format);
  iVar3 = std::filesystem::__cxx11::path::compare((path *)local_3f8);
  local_6e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar3 == 0);
  local_6e8.m_message.px = (element_type *)0x0;
  local_6e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_6f8 = (path *)0xe96108;
  local_6f0 = "";
  local_718.m_message.px = (element_type *)((ulong)local_718.m_message.px & 0xffffffffffffff00);
  local_718._0_8_ = &PTR__lazy_ostream_013ac130;
  local_718.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_700 = &local_720;
  local_740.m_message.px = (element_type *)((ulong)local_740.m_message.px & 0xffffffffffffff00);
  local_740._0_8_ = &PTR__lazy_ostream_013ac130;
  local_740.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_728 = &local_748;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_748 = (path *)local_650;
  local_720 = (path *)local_3f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_6e8,(lazy_ostream *)&local_a28,1,2,REQUIRE,0xe96783,(size_t)&local_6f8,0x179,
             &local_718,"fs::path{\"default\"}",&local_740);
  boost::detail::shared_count::~shared_count(&local_6e8.m_message.pn);
  std::filesystem::__cxx11::path::~path((path *)local_650);
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  std::filesystem::__cxx11::path::~path((path *)(local_548 + 0x20));
  if (local_690._0_8_ != (long)local_690 + 0x10) {
    operator_delete((void *)local_690._0_8_,local_690._16_8_ + 1);
  }
  local_3f8._0_8_ = &local_3e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"-dir","");
  ResetArgs(&local_args,(string *)local_3f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._0_8_ != &local_3e8) {
    operator_delete((void *)local_3f8._0_8_,local_3e8._M_allocated_capacity + 1);
  }
  local_a78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_a70 = "";
  local_a88 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a80 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0x17b;
  file_23.m_begin = (iterator)&local_a78;
  msg_23.m_end = pvVar5;
  msg_23.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_a88,
             msg_23);
  local_a28.m_message.px = (element_type *)((ulong)local_a28.m_message.px & 0xffffffffffffff00);
  local_a28._0_8_ = &PTR__lazy_ostream_013abb30;
  local_a28.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_a10 = "";
  local_6b0._0_8_ = (long)local_6b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6b0,"-dir","");
  local_650._0_8_ = (long)"wallet default" + 7;
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            ((path *)(local_548 + 0x20),(char **)local_650,auto_format);
  arg_23._M_string_length = in_stack_fffffffffffff560;
  arg_23._M_dataplus._M_p = (pointer)in_stack_fffffffffffff558;
  arg_23.field_2._M_allocated_capacity = in_stack_fffffffffffff568;
  arg_23.field_2._8_8_ = in_stack_fffffffffffff570;
  ArgsManager::GetPathArg((path *)local_3f8,&local_args,arg_23,(path *)local_6b0);
  local_718._0_8_ = "default";
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            ((path *)local_650,(char **)&local_718,auto_format);
  iVar3 = std::filesystem::__cxx11::path::compare((path *)local_3f8);
  local_6e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar3 == 0);
  local_6e8.m_message.px = (element_type *)0x0;
  local_6e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_6f8 = (path *)0xe96108;
  local_6f0 = "";
  local_718.m_message.px = (element_type *)((ulong)local_718.m_message.px & 0xffffffffffffff00);
  local_718._0_8_ = &PTR__lazy_ostream_013ac130;
  local_718.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_700 = &local_720;
  local_740.m_message.px = (element_type *)((ulong)local_740.m_message.px & 0xffffffffffffff00);
  local_740._0_8_ = &PTR__lazy_ostream_013ac130;
  local_740.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_728 = &local_748;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_748 = (path *)local_650;
  local_720 = (path *)local_3f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_6e8,(lazy_ostream *)&local_a28,1,2,REQUIRE,0xe96783,(size_t)&local_6f8,0x17b,
             &local_718,"fs::path{\"default\"}",&local_740);
  boost::detail::shared_count::~shared_count(&local_6e8.m_message.pn);
  std::filesystem::__cxx11::path::~path((path *)local_650);
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  std::filesystem::__cxx11::path::~path((path *)(local_548 + 0x20));
  if (local_6b0._0_8_ != (long)local_6b0 + 0x10) {
    operator_delete((void *)local_6b0._0_8_,local_6b0._16_8_ + 1);
  }
  local_3f8._0_8_ = &local_3e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"-nodir","");
  ResetArgs(&local_args,(string *)local_3f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._0_8_ != &local_3e8) {
    operator_delete((void *)local_3f8._0_8_,local_3e8._M_allocated_capacity + 1);
  }
  pcVar8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  pcVar9 = "";
  puVar6 = &boost::unit_test::basic_cstring<char_const>::null;
  puVar7 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0x17d;
  file_24.m_begin = &stack0xfffffffffffff568;
  msg_24.m_end = pvVar5;
  msg_24.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,
             (size_t)&stack0xfffffffffffff558,msg_24);
  local_a28.m_message.px = (element_type *)((ulong)local_a28.m_message.px & 0xffffffffffffff00);
  local_a28._0_8_ = &PTR__lazy_ostream_013abb30;
  local_a28.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_a10 = "";
  local_6d0._0_8_ = local_6d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6d0,"-dir","");
  local_650._0_8_ = (long)"wallet default" + 7;
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            ((path *)(local_548 + 0x20),(char **)local_650,auto_format);
  arg_24._M_string_length = (size_type)puVar7;
  arg_24._M_dataplus._M_p = puVar6;
  arg_24.field_2._M_allocated_capacity = (size_type)pcVar8;
  arg_24.field_2._8_8_ = pcVar9;
  ArgsManager::GetPathArg((path *)local_3f8,&local_args,arg_24,(path *)local_6d0);
  local_718._0_8_ = "";
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            ((path *)local_650,(char **)&local_718,auto_format);
  iVar3 = std::filesystem::__cxx11::path::compare((path *)local_3f8);
  local_6e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar3 == 0);
  local_6e8.m_message.px = (element_type *)0x0;
  local_6e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_6f8 = (path *)0xe96108;
  local_6f0 = "";
  local_718.m_message.px = (element_type *)((ulong)local_718.m_message.px & 0xffffffffffffff00);
  local_718._0_8_ = &PTR__lazy_ostream_013ac130;
  local_718.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_700 = &local_720;
  local_740.m_message.px = (element_type *)((ulong)local_740.m_message.px & 0xffffffffffffff00);
  local_740._0_8_ = &PTR__lazy_ostream_013ac130;
  local_740.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_728 = &local_748;
  local_748 = (path *)local_650;
  local_720 = (path *)local_3f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_6e8,(lazy_ostream *)&local_a28,1,2,REQUIRE,0xe96783,(size_t)&local_6f8,0x17d,
             &local_718,"fs::path{\"\"}",&local_740);
  boost::detail::shared_count::~shared_count(&local_6e8.m_message.pn);
  std::filesystem::__cxx11::path::~path((path *)local_650);
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  std::filesystem::__cxx11::path::~path((path *)(local_548 + 0x20));
  if ((undefined1 *)local_6d0._0_8_ != local_6d0 + 0x10) {
    operator_delete((void *)local_6d0._0_8_,local_6d0._16_8_ + 1);
  }
  std::filesystem::__cxx11::path::~path(&relative_path.super_path);
  std::filesystem::__cxx11::path::~path(&absolute_path.super_path);
  std::filesystem::__cxx11::path::~path(&root_path.super_path);
  ArgsManager::~ArgsManager(&local_args);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(patharg)
{
    ArgsManager local_args;

    const auto dir = std::make_pair("-dir", ArgsManager::ALLOW_ANY);
    SetupArgs(local_args, {dir});
    ResetArgs(local_args, "");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), fs::path{});

    const fs::path root_path{"/"};
    ResetArgs(local_args, "-dir=/");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), root_path);

    ResetArgs(local_args, "-dir=/.");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), root_path);

    ResetArgs(local_args, "-dir=/./");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), root_path);

    ResetArgs(local_args, "-dir=/.//");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), root_path);

#ifdef WIN32
    const fs::path win_root_path{"C:\\"};
    ResetArgs(local_args, "-dir=C:\\");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), win_root_path);

    ResetArgs(local_args, "-dir=C:/");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), win_root_path);

    ResetArgs(local_args, "-dir=C:\\\\");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), win_root_path);

    ResetArgs(local_args, "-dir=C:\\.");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), win_root_path);

    ResetArgs(local_args, "-dir=C:\\.\\");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), win_root_path);

    ResetArgs(local_args, "-dir=C:\\.\\\\");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), win_root_path);
#endif

    const fs::path absolute_path{"/home/user/.bitcoin"};
    ResetArgs(local_args, "-dir=/home/user/.bitcoin");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), absolute_path);

    ResetArgs(local_args, "-dir=/root/../home/user/.bitcoin");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), absolute_path);

    ResetArgs(local_args, "-dir=/home/./user/.bitcoin");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), absolute_path);

    ResetArgs(local_args, "-dir=/home/user/.bitcoin/");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), absolute_path);

    ResetArgs(local_args, "-dir=/home/user/.bitcoin//");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), absolute_path);

    ResetArgs(local_args, "-dir=/home/user/.bitcoin/.");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), absolute_path);

    ResetArgs(local_args, "-dir=/home/user/.bitcoin/./");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), absolute_path);

    ResetArgs(local_args, "-dir=/home/user/.bitcoin/.//");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), absolute_path);

    const fs::path relative_path{"user/.bitcoin"};
    ResetArgs(local_args, "-dir=user/.bitcoin");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), relative_path);

    ResetArgs(local_args, "-dir=somewhere/../user/.bitcoin");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), relative_path);

    ResetArgs(local_args, "-dir=user/./.bitcoin");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), relative_path);

    ResetArgs(local_args, "-dir=user/.bitcoin/");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), relative_path);

    ResetArgs(local_args, "-dir=user/.bitcoin//");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), relative_path);

    ResetArgs(local_args, "-dir=user/.bitcoin/.");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), relative_path);

    ResetArgs(local_args, "-dir=user/.bitcoin/./");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), relative_path);

    ResetArgs(local_args, "-dir=user/.bitcoin/.//");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), relative_path);

    // Check negated and default argument handling. Specifying an empty argument
    // is the same as not specifying the argument. This is convenient for
    // scripting so later command line arguments can override earlier command
    // line arguments or bitcoin.conf values. Currently the -dir= case cannot be
    // distinguished from -dir case with no assignment, but #16545 would add the
    // ability to distinguish these in the future (and treat the no-assign case
    // like an imperative command or an error).
    ResetArgs(local_args, "");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir", "default"), fs::path{"default"});
    ResetArgs(local_args, "-dir=override");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir", "default"), fs::path{"override"});
    ResetArgs(local_args, "-dir=");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir", "default"), fs::path{"default"});
    ResetArgs(local_args, "-dir");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir", "default"), fs::path{"default"});
    ResetArgs(local_args, "-nodir");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir", "default"), fs::path{""});
}